

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O0

ParseResult __thiscall
xe::TestResultParser::parse(TestResultParser *this,deUint8 *bytes,int numBytes)

{
  Element EVar1;
  TestResultParseError *this_00;
  TestResultParseError *e;
  ParseError *e_1;
  string local_58;
  Element local_38;
  Element curElement;
  byte local_25;
  int local_24;
  bool resultChanged;
  deUint8 *pdStack_20;
  int numBytes_local;
  deUint8 *bytes_local;
  TestResultParser *this_local;
  
  local_25 = 0;
  local_24 = numBytes;
  pdStack_20 = bytes;
  bytes_local = (deUint8 *)this;
  xml::Parser::feed(&this->m_xmlParser,bytes,numBytes);
  while ((local_38 = xml::Parser::getElement(&this->m_xmlParser), local_38 != ELEMENT_INCOMPLETE &&
         (local_38 != ELEMENT_END_OF_STRING))) {
    if (local_38 == ELEMENT_START) {
      handleElementStart(this);
    }
    else if (local_38 == ELEMENT_END) {
      handleElementEnd(this);
    }
    else if (local_38 == ELEMENT_DATA) {
      handleData(this);
    }
    local_25 = 1;
    xml::Parser::advance(&this->m_xmlParser);
  }
  EVar1 = xml::Parser::getElement(&this->m_xmlParser);
  if (EVar1 == ELEMENT_END_OF_STRING) {
    if (this->m_state != STATE_TEST_CASE_RESULT_ENDED) {
      e_1._6_1_ = 1;
      this_00 = (TestResultParseError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Unexpected end of log data",
                 (allocator<char> *)((long)&e_1 + 7));
      TestResultParseError::TestResultParseError(this_00,&local_58);
      e_1._6_1_ = 0;
      __cxa_throw(this_00,&TestResultParseError::typeinfo,
                  TestResultParseError::~TestResultParseError);
    }
    this_local._4_4_ = PARSERESULT_COMPLETE;
  }
  else {
    this_local._4_4_ = (ParseResult)((local_25 & 1) != 0);
  }
  return this_local._4_4_;
}

Assistant:

TestResultParser::ParseResult TestResultParser::parse (const deUint8* bytes, int numBytes)
{
	DE_ASSERT(m_result && m_state != STATE_NOT_INITIALIZED);

	try
	{
		bool resultChanged = false;

		m_xmlParser.feed(bytes, numBytes);

		for (;;)
		{
			xml::Element curElement = m_xmlParser.getElement();

			if (curElement == xml::ELEMENT_INCOMPLETE	||
				curElement == xml::ELEMENT_END_OF_STRING)
				break;

			switch (curElement)
			{
				case xml::ELEMENT_START:	handleElementStart();		break;
				case xml::ELEMENT_END:		handleElementEnd();			break;
				case xml::ELEMENT_DATA:		handleData();				break;

				default:
					DE_ASSERT(false);
			}

			resultChanged = true;
			m_xmlParser.advance();
		}

		if (m_xmlParser.getElement() == xml::ELEMENT_END_OF_STRING)
		{
			if (m_state != STATE_TEST_CASE_RESULT_ENDED)
				throw TestResultParseError("Unexpected end of log data");

			return PARSERESULT_COMPLETE;
		}
		else
			return resultChanged ? PARSERESULT_CHANGED
								 : PARSERESULT_NOT_CHANGED;
	}
	catch (const TestResultParseError& e)
	{
		// Set error code to result.
		m_result->statusCode	= TESTSTATUSCODE_INTERNAL_ERROR;
		m_result->statusDetails	= e.what();

		return PARSERESULT_ERROR;
	}
	catch (const xml::ParseError& e)
	{
		// Set error code to result.
		m_result->statusCode	= TESTSTATUSCODE_INTERNAL_ERROR;
		m_result->statusDetails	= e.what();

		return PARSERESULT_ERROR;
	}
}